

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_.cxx
# Opt level: O2

void __thiscall Fl_Menu_::setonly(Fl_Menu_ *this,Fl_Menu_Item *item)

{
  Fl_Menu_Item *pFVar1;
  int *piVar2;
  uint uVar3;
  Fl_Menu_Item *pFVar4;
  
  pFVar1 = first_submenu_item(item,this->menu_);
  if (pFVar1 != (Fl_Menu_Item *)0x0) {
    uVar3 = item->flags | 0xc;
    item->flags = uVar3;
    for (piVar2 = &item[1].flags;
        ((-1 < (char)uVar3 && (((Fl_Menu_Item *)(piVar2 + -8))->text != (char *)0x0)) &&
        ((*piVar2 & 8U) != 0)); piVar2 = piVar2 + 0xe) {
      uVar3 = *piVar2 & 0xfffffffb;
      *piVar2 = uVar3;
    }
    while (((pFVar4 = item + -1, pFVar1 <= pFVar4 && (pFVar4->text != (char *)0x0)) &&
           ((item[-1].flags & 0x88U) == 8))) {
      item[-1].flags = item[-1].flags & 0xffffff7b;
      item = pFVar4;
    }
  }
  return;
}

Assistant:

void Fl_Menu_::setonly(Fl_Menu_Item* item) {
  // find the first item of the (sub)menu containing item
  Fl_Menu_Item* first = first_submenu_item(item, menu_);
  if (!first) return; // item does not belong to our menu
  item->flags |= FL_MENU_RADIO | FL_MENU_VALUE;
  Fl_Menu_Item* j;
  for (j = item; ; ) {	// go down
    if (j->flags & FL_MENU_DIVIDER) break; // stop on divider lines
    j++;
    if (!j->text || !j->radio()) break; // stop after group
    j->clear();
  }
  for (j = item-1; j>=first; j--) { // go up
    //DEBUG printf("GO UP: WORKING ON: item='%s', flags=%x\n", j->text, j->flags);
    if (!j->text || (j->flags&FL_MENU_DIVIDER) || !j->radio()) break;
    j->clear();
  }
}